

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack_encoder.hpp
# Opt level: O0

bool __thiscall
jsoncons::msgpack::basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::
visit_string(basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,
            string_view_type *sv,semantic_tag tag,ser_context *param_4,error_code *ec)

{
  bool bVar1;
  long *n_00;
  const_pointer pvVar2;
  basic_bigint<std::allocator<unsigned_char>_> *this_00;
  basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this_01;
  char in_DL;
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  size_t in_RDI;
  type tVar3;
  int64_t nanoseconds_1;
  int64_t seconds_2;
  bigint rem_1;
  bigint q_1;
  bigint n_1;
  int64_t nanoseconds;
  int64_t seconds_1;
  bigint rem;
  bigint q;
  bigint n;
  type result;
  int64_t seconds;
  basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>
  *in_stack_fffffffffffffdf0;
  undefined8 in_stack_fffffffffffffdf8;
  msgpack_errc __e;
  error_code *in_stack_fffffffffffffe00;
  long in_stack_fffffffffffffe08;
  basic_bigint<std::allocator<unsigned_char>_> *in_stack_fffffffffffffe10;
  undefined8 in_stack_fffffffffffffe18;
  int iVar4;
  basic_bigint<std::allocator<unsigned_char>_> *in_stack_fffffffffffffe20;
  undefined7 in_stack_fffffffffffffe30;
  int64_t in_stack_fffffffffffffe38;
  basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *seconds_00;
  basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>
  *in_stack_fffffffffffffe40;
  string_view_type *in_stack_fffffffffffffe98;
  basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>
  *in_stack_fffffffffffffea0;
  size_type in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  char *local_48;
  to_integer_errc local_40;
  basic_string_view<char,_std::char_traits<char>_> *local_18;
  
  __e = (msgpack_errc)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
  iVar4 = (int)((ulong)in_stack_fffffffffffffe18 >> 0x20);
  local_18 = in_RSI;
  if (in_DL == '\x05') {
    n_00 = (long *)std::basic_string_view<char,_std::char_traits<char>_>::data(in_RSI);
    std::basic_string_view<char,_std::char_traits<char>_>::length(local_18);
    tVar3 = detail::to_integer<long,char>
                      ((char *)CONCAT17(in_DL,in_stack_fffffffffffffe30),in_RDI,n_00);
    local_48 = tVar3.ptr;
    local_40 = tVar3.ec;
    bVar1 = detail::to_integer_result::operator_cast_to_bool((to_integer_result *)&local_48);
    if (bVar1) {
      write_timestamp(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                      CONCAT17(in_DL,in_stack_fffffffffffffe30));
    }
    else {
      std::error_code::operator=(in_stack_fffffffffffffe00,__e);
    }
  }
  else if (in_DL == '\x06') {
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data(in_RSI);
    iVar4 = (int)((ulong)pvVar2 >> 0x20);
    std::basic_string_view<char,_std::char_traits<char>_>::length(local_18);
    basic_bigint<std::allocator<unsigned_char>_>::from_string<char>
              (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    bVar1 = jsoncons::operator!=(in_stack_fffffffffffffe20,iVar4);
    if (bVar1) {
      basic_bigint<std::allocator<unsigned_char>_>::basic_bigint
                ((basic_bigint<std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe00);
      basic_bigint<std::allocator<unsigned_char>_>::basic_bigint
                ((basic_bigint<std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe00);
      basic_bigint<std::allocator<unsigned_char>_>::basic_bigint<long>
                (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
      basic_bigint<std::allocator<unsigned_char>_>::divide
                ((basic_bigint<std::allocator<unsigned_char>_> *)n_1.field_0.short_stor_.values_[0],
                 (basic_bigint<std::allocator<unsigned_char>_> *)n_1.field_0.common_stor_.length_,
                 (basic_bigint<std::allocator<unsigned_char>_> *)n_1.field_0._0_8_,
                 (basic_bigint<std::allocator<unsigned_char>_> *)n_1._0_8_,
                 (bool)q_1.field_0.short_stor_.values_[1]._7_1_);
      basic_bigint<std::allocator<unsigned_char>_>::~basic_bigint
                ((basic_bigint<std::allocator<unsigned_char>_> *)in_stack_fffffffffffffdf0);
      basic_bigint::operator_cast_to_long
                ((basic_bigint<std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe00);
      basic_bigint::operator_cast_to_long
                ((basic_bigint<std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe00);
      write_timestamp(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                      CONCAT17(in_DL,in_stack_fffffffffffffe30));
      basic_bigint<std::allocator<unsigned_char>_>::~basic_bigint
                ((basic_bigint<std::allocator<unsigned_char>_> *)in_stack_fffffffffffffdf0);
      basic_bigint<std::allocator<unsigned_char>_>::~basic_bigint
                ((basic_bigint<std::allocator<unsigned_char>_> *)in_stack_fffffffffffffdf0);
    }
    else {
      write_timestamp(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                      CONCAT17(in_DL,in_stack_fffffffffffffe30));
    }
    basic_bigint<std::allocator<unsigned_char>_>::~basic_bigint
              ((basic_bigint<std::allocator<unsigned_char>_> *)in_stack_fffffffffffffdf0);
  }
  else if (in_DL == '\a') {
    this_00 = (basic_bigint<std::allocator<unsigned_char>_> *)
              std::basic_string_view<char,_std::char_traits<char>_>::data(in_RSI);
    std::basic_string_view<char,_std::char_traits<char>_>::length(local_18);
    basic_bigint<std::allocator<unsigned_char>_>::from_string<char>
              (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    bVar1 = jsoncons::operator!=(in_stack_fffffffffffffe20,iVar4);
    if (bVar1) {
      basic_bigint<std::allocator<unsigned_char>_>::basic_bigint(this_00);
      basic_bigint<std::allocator<unsigned_char>_>::basic_bigint(this_00);
      basic_bigint<std::allocator<unsigned_char>_>::basic_bigint<long>
                (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,this_00);
      basic_bigint<std::allocator<unsigned_char>_>::divide
                ((basic_bigint<std::allocator<unsigned_char>_> *)n_1.field_0.short_stor_.values_[0],
                 (basic_bigint<std::allocator<unsigned_char>_> *)n_1.field_0.common_stor_.length_,
                 (basic_bigint<std::allocator<unsigned_char>_> *)n_1.field_0._0_8_,
                 (basic_bigint<std::allocator<unsigned_char>_> *)n_1._0_8_,
                 (bool)q_1.field_0.short_stor_.values_[1]._7_1_);
      basic_bigint<std::allocator<unsigned_char>_>::~basic_bigint
                ((basic_bigint<std::allocator<unsigned_char>_> *)in_stack_fffffffffffffdf0);
      this_01 = (basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *)
                basic_bigint::operator_cast_to_long(this_00);
      in_stack_fffffffffffffdf0 =
           (basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *)
           basic_bigint::operator_cast_to_long(this_00);
      seconds_00 = in_stack_fffffffffffffdf0;
      if ((long)in_stack_fffffffffffffdf0 < 0) {
        seconds_00 = (basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *)
                     -(long)in_stack_fffffffffffffdf0;
      }
      write_timestamp(this_01,(int64_t)seconds_00,CONCAT17(in_DL,in_stack_fffffffffffffe30));
      basic_bigint<std::allocator<unsigned_char>_>::~basic_bigint
                ((basic_bigint<std::allocator<unsigned_char>_> *)in_stack_fffffffffffffdf0);
      basic_bigint<std::allocator<unsigned_char>_>::~basic_bigint
                ((basic_bigint<std::allocator<unsigned_char>_> *)in_stack_fffffffffffffdf0);
    }
    else {
      write_timestamp(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                      CONCAT17(in_DL,in_stack_fffffffffffffe30));
    }
    basic_bigint<std::allocator<unsigned_char>_>::~basic_bigint
              ((basic_bigint<std::allocator<unsigned_char>_> *)in_stack_fffffffffffffdf0);
  }
  else {
    write_string_value(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    end_value(in_stack_fffffffffffffdf0);
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_string(const string_view_type& sv, semantic_tag tag, const ser_context&, std::error_code& ec) final
        {
            switch (tag)
            {
                case semantic_tag::epoch_second:
                {
                    int64_t seconds;
                    auto result = jsoncons::detail::to_integer(sv.data(), sv.length(), seconds);
                    if (!result)
                    {
                        ec = msgpack_errc::invalid_timestamp;
                        JSONCONS_VISITOR_RETURN;
                    }
                    write_timestamp(seconds, 0);
                    break;
                }
                case semantic_tag::epoch_milli:
                {
                    bigint n = bigint::from_string(sv.data(), sv.length());
                    if (n != 0)
                    {
                        bigint q;
                        bigint rem;
                        n.divide(millis_in_second, q, rem, true);
                        auto seconds = static_cast<int64_t>(q);
                        auto nanoseconds = static_cast<int64_t>(rem) * nanos_in_milli;
                        if (nanoseconds < 0)
                        {
                            nanoseconds = -nanoseconds; 
                        }
                        write_timestamp(seconds, nanoseconds);
                    }
                    else
                    {
                        write_timestamp(0, 0);
                    }
                    break;
                }
                case semantic_tag::epoch_nano:
                {
                    bigint n = bigint::from_string(sv.data(), sv.length());
                    if (n != 0)
                    {
                        bigint q;
                        bigint rem;
                        n.divide(nanos_in_second, q, rem, true);
                        auto seconds = static_cast<int64_t>(q);
                        auto nanoseconds = static_cast<int64_t>(rem);
                        if (nanoseconds < 0)
                        {
                            nanoseconds = -nanoseconds; 
                        }
                        write_timestamp(seconds, nanoseconds);
                    }
                    else
                    {
                        write_timestamp(0, 0);
                    }
                    break;
                }
                default:
                {
                    write_string_value(sv);
                    end_value();
                    break;
                }
            }
            JSONCONS_VISITOR_RETURN;
        }